

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O0

void __thiscall
cmComputeLinkDepends::CheckWrongConfigItem(cmComputeLinkDepends *this,cmLinkItem *item)

{
  bool bVar1;
  cmLinkItem *item_local;
  cmComputeLinkDepends *this_local;
  
  if ((((this->OldLinkDirMode & 1U) != 0) && (item->Target != (cmTarget *)0x0)) &&
     (bVar1 = cmTarget::IsImported(item->Target), !bVar1)) {
    std::set<const_cmTarget_*,_std::less<const_cmTarget_*>,_std::allocator<const_cmTarget_*>_>::
    insert(&this->OldWrongConfigItems,&item->Target);
  }
  return;
}

Assistant:

void cmComputeLinkDepends::CheckWrongConfigItem(cmLinkItem const& item)
{
  if(!this->OldLinkDirMode)
    {
    return;
    }

  // For CMake 2.4 bug-compatibility we need to consider the output
  // directories of targets linked in another configuration as link
  // directories.
  if(item.Target && !item.Target->IsImported())
    {
    this->OldWrongConfigItems.insert(item.Target);
    }
}